

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unixFileSize(unqlite_file *id,sxi64 *pSize)

{
  int iVar1;
  int *piVar2;
  sxi64 sVar3;
  stat buf;
  
  iVar1 = fstat(*(int *)&id[2].pMethods,(stat *)&buf);
  if (iVar1 == 0) {
    iVar1 = 0;
    sVar3 = 0;
    if (buf.st_size != 1) {
      sVar3 = buf.st_size;
    }
    *pSize = sVar3;
  }
  else {
    piVar2 = __errno_location();
    *(int *)((long)&id[3].pMethods + 4) = *piVar2;
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

static int unixFileSize(unqlite_file *id,sxi64 *pSize){
  int rc;
  struct stat buf;
  
  rc = fstat(((unixFile*)id)->h, &buf);
  
  if( rc!=0 ){
    ((unixFile*)id)->lastErrno = errno;
    return UNQLITE_IOERR;
  }
  *pSize = buf.st_size;

  /* When opening a zero-size database, the findInodeInfo() procedure
  ** writes a single byte into that file in order to work around a bug
  ** in the OS-X msdos filesystem.  In order to avoid problems with upper
  ** layers, we need to report this file size as zero even though it is
  ** really 1.   Ticket #3260.
  */
  if( *pSize==1 ) *pSize = 0;

  return UNQLITE_OK;
}